

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O0

uint ReadCharFromStream(StreamIn *in)

{
  Bool BVar1;
  uint uVar2;
  int local_30;
  uint c1_2;
  int count;
  int err;
  uint c1_1;
  uint c1;
  uint n;
  uint c;
  StreamIn *in_local;
  
  _n = in;
  BVar1 = prvTidyIsEOF(in);
  if (BVar1 == no) {
    c1 = ReadByte(_n);
    in_local._4_4_ = c1;
    if (c1 != 0xffffffff) {
      if (_n->encoding == 5) {
        if (c1 == 0x1b) {
          _n->state = FSM_ESC;
        }
        else {
          switch(_n->state) {
          case FSM_ASCII:
            break;
          case FSM_ESC:
            if (c1 == 0x24) {
              _n->state = FSM_ESCD;
            }
            else if (c1 == 0x28) {
              _n->state = FSM_ESCP;
            }
            else {
              _n->state = FSM_ASCII;
            }
            break;
          case FSM_ESCD:
            if (c1 == 0x28) {
              _n->state = FSM_ESCDP;
            }
            else {
              _n->state = FSM_NONASCII;
            }
            break;
          case FSM_ESCDP:
            _n->state = FSM_NONASCII;
            break;
          case FSM_ESCP:
            _n->state = FSM_ASCII;
            break;
          case FSM_NONASCII:
            c1 = c1 | 0x80;
          }
          in_local._4_4_ = c1;
        }
      }
      else if (_n->encoding == 9) {
        uVar2 = ReadByte(_n);
        if (uVar2 == 0xffffffff) {
          in_local._4_4_ = 0xffffffff;
        }
        else {
          in_local._4_4_ = uVar2 * 0x100 + c1;
        }
      }
      else if ((_n->encoding == 0xb) || (_n->encoding == 10)) {
        uVar2 = ReadByte(_n);
        if (uVar2 == 0xffffffff) {
          in_local._4_4_ = 0xffffffff;
        }
        else {
          in_local._4_4_ = c1 * 0x100 + uVar2;
        }
      }
      else if (_n->encoding == 4) {
        local_30 = 0;
        c1_2 = prvTidyDecodeUTF8BytesToChar(&c1_1,c1,(ctmbstr)0x0,&_n->source,&local_30);
        if (((c1_2 == 0) && (c1_1 == 0xffffffff)) && (local_30 == 1)) {
          in_local._4_4_ = 0xffffffff;
        }
        else {
          if (c1_2 != 0) {
            _n->doc->lexer->lines = _n->curline;
            _n->doc->lexer->columns = _n->curcol;
            prvTidyReportEncodingError(_n->doc,0x24b,c1_1,no);
            c1_1 = 0xfffd;
          }
          in_local._4_4_ = c1_1;
        }
      }
      else if ((((_n->encoding == 0xc) || (_n->encoding == 0xd)) && (0x7f < c1)) &&
              (((_n->encoding != 0xd || (c1 < 0xa1)) || (0xdf < c1)))) {
        uVar2 = ReadByte(_n);
        if (uVar2 == 0xffffffff) {
          in_local._4_4_ = 0xffffffff;
        }
        else {
          in_local._4_4_ = c1 * 0x100 + uVar2;
        }
      }
    }
  }
  else {
    in_local._4_4_ = 0xffffffff;
  }
  return in_local._4_4_;
}

Assistant:

static uint ReadCharFromStream( StreamIn* in )
{
    uint c, n;

    if ( TY_(IsEOF)(in) )
        return EndOfStream;
    
    c = ReadByte( in );

    if (c == EndOfStream)
        return c;

#ifndef NO_NATIVE_ISO2022_SUPPORT
    /*
       A document in ISO-2022 based encoding uses some ESC sequences
       called "designator" to switch character sets. The designators
       defined and used in ISO-2022-JP are:

        "ESC" + "(" + ?     for ISO646 variants

        "ESC" + "$" + ?     and
        "ESC" + "$" + "(" + ?   for multibyte character sets

       Where ? stands for a single character used to indicate the
       character set for multibyte characters.

       Tidy handles this by preserving the escape sequence and
       setting the top bit of each byte for non-ascii chars. This
       bit is then cleared on output. The input stream keeps track
       of the state to determine when to set/clear the bit.
    */

    if (in->encoding == ISO2022)
    {
        if (c == 0x1b)  /* ESC */
        {
            in->state = FSM_ESC;
            return c;
        }

        switch (in->state)
        {
        case FSM_ESC:
            if (c == '$')
                in->state = FSM_ESCD;
            else if (c == '(')
                in->state = FSM_ESCP;
            else
                in->state = FSM_ASCII;
            break;

        case FSM_ESCD:
            if (c == '(')
                in->state = FSM_ESCDP;
            else
                in->state = FSM_NONASCII;
            break;

        case FSM_ESCDP:
            in->state = FSM_NONASCII;
            break;

        case FSM_ESCP:
            in->state = FSM_ASCII;
            break;

        case FSM_NONASCII:
            c |= 0x80;
            break;

        case FSM_ASCII:
            break;
        }

        return c;
    }
#endif /* NO_NATIVE_ISO2022_SUPPORT */

    if ( in->encoding == UTF16LE )
    {
        uint c1 = ReadByte( in );
        if ( EndOfStream == c1 )
            return EndOfStream;
        n = (c1 << 8) + c;
        return n;
    }

    if ((in->encoding == UTF16) || (in->encoding == UTF16BE)) /* UTF-16 is big-endian by default */
    {
        uint c1 = ReadByte( in );
        if ( EndOfStream == c1 )
            return EndOfStream;
        n = (c << 8) + c1;
        return n;
    }

    if ( in->encoding == UTF8 )
    {
        /* deal with UTF-8 encoded char */

        int err, count = 0;
        
        /* first byte "c" is passed in separately */
        err = TY_(DecodeUTF8BytesToChar)( &n, c, NULL, &in->source, &count );
        if (!err && (n == (uint)EndOfStream) && (count == 1)) /* EOF */
            return EndOfStream;
        else if (err)
        {
            /* set error position just before offending character */
            in->doc->lexer->lines = in->curline;
            in->doc->lexer->columns = in->curcol;

            TY_(ReportEncodingError)(in->doc, INVALID_UTF8, n, no);
            n = 0xFFFD; /* replacement char */
        }
        
        return n;
    }
    
    /*
       This section is suitable for any "multibyte" variable-width 
       character encoding in which a one-byte code is less than
       128, and the first byte of a two-byte code is greater or
       equal to 128. Note that Big5 and ShiftJIS fit into this
       kind, even though their second byte may be less than 128
    */
    if ((in->encoding == BIG5) || (in->encoding == SHIFTJIS))
    {
        if (c < 128)
            return c;
        else if ((in->encoding == SHIFTJIS) && (c >= 0xa1 && c <= 0xdf)) /* 461643 - fix suggested by Rick Cameron 14 Sep 01 */
        {
            /*
              Rick Cameron pointed out that for Shift_JIS, the values from
              0xa1 through 0xdf represent singe-byte characters
              (U+FF61 to U+FF9F - half-shift Katakana)
            */
            return c;
        }
        else
        {
            uint c1 = ReadByte( in );
            if ( EndOfStream == c1 )
                return EndOfStream;
            n = (c << 8) + c1;
            return n;
        }
    }
    else
        n = c;
        
    return n;
}